

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O1

void __thiscall RTVector3::accelToQuaternion(RTVector3 *this,RTQuaternion *qPose)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  RTVector3 vec;
  RTVector3 z;
  RTVector3 local_2c;
  double local_20;
  RTVector3 local_14;
  
  local_20 = (double)CONCAT44(local_20._4_4_,this->m_data[0]);
  fVar5 = this->m_data[1];
  fVar4 = this->m_data[2];
  RTVector3(&local_2c);
  RTVector3(&local_14,0.0,0.0,1.0);
  fVar3 = fVar4 * fVar4 + local_20._0_4_ * local_20._0_4_ + fVar5 * fVar5;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  bVar1 = NAN(fVar3);
  bVar2 = fVar3 == 0.0;
  fVar7 = fVar5 / fVar3;
  if ((bVar2) && (!bVar1)) {
    fVar7 = fVar5;
  }
  fVar5 = local_20._0_4_ / fVar3;
  if ((bVar2) && (!bVar1)) {
    fVar5 = local_20._0_4_;
  }
  fVar3 = fVar4 / fVar3;
  if ((bVar2) && (!bVar1)) {
    fVar3 = fVar4;
  }
  local_20 = (double)CONCAT44(local_20._4_4_,fVar3);
  fVar4 = acosf(local_14.m_data[2] * fVar3 + local_14.m_data[0] * fVar5 + local_14.m_data[1] * fVar7
               );
  local_2c.m_data[0] = fVar7 * local_14.m_data[2] - local_14.m_data[1] * local_20._0_4_;
  local_2c.m_data[1] = local_20._0_4_ * local_14.m_data[0] - local_14.m_data[2] * fVar5;
  local_2c.m_data[2] = fVar5 * local_14.m_data[1] - local_14.m_data[0] * fVar7;
  fVar5 = local_2c.m_data[2] * local_2c.m_data[2] +
          local_2c.m_data[0] * local_2c.m_data[0] + local_2c.m_data[1] * local_2c.m_data[1];
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    local_2c.m_data[0] = local_2c.m_data[0] / fVar5;
    local_2c.m_data[1] = local_2c.m_data[1] / fVar5;
    local_2c.m_data[2] = local_2c.m_data[2] / fVar5;
  }
  local_20 = (double)fVar4 * 0.5;
  dVar6 = sin(local_20);
  fVar5 = (float)dVar6;
  dVar6 = cos(local_20);
  qPose->m_data[0] = (float)dVar6;
  qPose->m_data[1] = local_2c.m_data[0] * fVar5;
  qPose->m_data[2] = local_2c.m_data[1] * fVar5;
  qPose->m_data[3] = fVar5 * local_2c.m_data[2];
  return;
}

Assistant:

void RTVector3::accelToQuaternion(RTQuaternion& qPose) const
{
    RTVector3 normAccel = *this;
    RTVector3 vec;
    RTVector3 z(0, 0, 1.0);

    normAccel.normalize();

    RTFLOAT angle = acos(RTVector3::dotProduct(z, normAccel));
    RTVector3::crossProduct(normAccel, z, vec);
    vec.normalize();

    qPose.fromAngleVector(angle, vec);
}